

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void block_free_heap(AD *ad)

{
  AD *in_RDI;
  AD **unaff_retaddr;
  _func_void_AD_ptr *action;
  AD *max_ad;
  AD *ad2;
  _func_Boolean_AD_ptr_AD_ptr *pred;
  AD *list;
  _AD *ad_00;
  
  list = (AD *)0x0;
  for (ad_00 = ma_hused; ad_00 != (AD *)0x0; ad_00 = ad_00->next) {
    if (list < ad_00) {
      list = ad_00;
    }
  }
  if (list == (AD *)0x0) {
    ma_hp = ma_segment;
    ma_hfree = (AD *)0x0;
  }
  else {
    ma_hp = list->name + (list->nbytes - 0x10);
    pred = (_func_Boolean_AD_ptr_AD_ptr *)0x0;
    list_delete_many(unaff_retaddr,(_func_Boolean_AD_ptr_Pointer *)in_RDI,(Pointer)0x0,
                     (_func_void_AD_ptr *)list);
    if (in_RDI < list) {
      list_insert_ordered(ad_00,(AD **)list,pred);
      list_coalesce(ma_hfree);
    }
  }
  return;
}

Assistant:

private void block_free_heap(ad)
    AD        *ad;        /* AD to free */
{
    AD        *ad2;        /* traversal pointer */
    AD        *max_ad;    /* rightmost AD */

    /* find rightmost heap block */
    for (max_ad = (AD *)NULL, ad2 = ma_hused; ad2; ad2 = ad2->next)
    {
        if (ad2 > max_ad)
            max_ad = ad2;
    }

    if (max_ad)
    {
        /* at least 1 block is in use */

        /* set ma_hp to first address past end of max_ad */
        ma_hp = (Pointer)max_ad + max_ad->nbytes;

        /* delete any free list blocks that are no longer in heap region */
	void (*action)(AD *);
	action= NULL;
        (void)list_delete_many(
            &ma_hfree,
            ad_gt,
            (Pointer)max_ad,
            action);

        /* if ad is in the heap region, add it to free list */
        if (ad < max_ad)
        {
            list_insert_ordered(ad, &ma_hfree, ad_lt);
            list_coalesce(ma_hfree);
        }
    }
    else
    {
        /* no blocks are in use */

        /* set ma_hp to start of segment */
        ma_hp = ma_segment;

        /* clear the free list */
        ma_hfree = (AD *)NULL;
    }
}